

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decallib.cpp
# Opt level: O2

DThinker * __thiscall
FDecalSliderAnim::CreateThinker(FDecalSliderAnim *this,DBaseDecal *actor,side_t *wall)

{
  DDecalSlider *this_00;
  int iVar1;
  
  this_00 = (DDecalSlider *)DObject::operator_new(0x68);
  DDecalSlider::DDecalSlider(this_00,actor);
  iVar1 = *(int *)&(this->super_FDecalAnimator).field_0xc + level.maptime;
  this_00->TimeToStart = iVar1;
  this_00->TimeToStop = iVar1 + this->SlideTime;
  this_00->DistY = this->DistY;
  this_00->bStarted = false;
  return (DThinker *)this_00;
}

Assistant:

DThinker *FDecalSliderAnim::CreateThinker (DBaseDecal *actor, side_t *wall) const
{
	DDecalSlider *thinker = new DDecalSlider (actor);

	thinker->TimeToStart = level.maptime + SlideStart;
	thinker->TimeToStop = thinker->TimeToStart + SlideTime;
	/*thinker->DistX = DistX;*/
	thinker->DistY = DistY;
	thinker->bStarted = false;
	return thinker;
}